

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_max_stream_data_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  int iVar1;
  quicly_stream_t *stream_00;
  quicly_conn_t *in_RDI;
  int ret;
  quicly_stream_t *stream;
  quicly_max_stream_data_frame_t frame;
  uint in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint8_t *in_stack_ffffffffffffffd0;
  quicly_conn_t *in_stack_ffffffffffffffd8;
  st_quicly_conn_t *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = quicly_decode_max_stream_data_frame
                      ((uint8_t **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                       (quicly_max_stream_data_frame_t *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (local_4 == 0) {
    QUICLY_TRACER_MAX_STREAM_DATA_RECEIVE
              (in_stack_ffffffffffffffe0,(int64_t)in_stack_ffffffffffffffd8,
               (int64_t)in_stack_ffffffffffffffd0,(ulong)in_stack_ffffffffffffffc8);
    quicly_is_client(in_RDI);
    iVar1 = quicly_stream_has_send_side
                      ((int)in_stack_ffffffffffffffd0,CONCAT44(local_4,in_stack_ffffffffffffffc8));
    if (iVar1 == 0) {
      local_4 = 0x20007;
    }
    else {
      stream_00 = quicly_get_stream(in_stack_ffffffffffffffd8,
                                    (quicly_stream_id_t)in_stack_ffffffffffffffd0);
      if (stream_00 == (quicly_stream_t *)0x0) {
        local_4 = 0;
      }
      else if (in_stack_ffffffffffffffe0 <
               (st_quicly_conn_t *)(stream_00->_send_aux).max_stream_data) {
        local_4 = 0;
      }
      else {
        (stream_00->_send_aux).max_stream_data = (uint64_t)in_stack_ffffffffffffffe0;
        (stream_00->_send_aux).blocked = QUICLY_SENDER_STATE_NONE;
        if ((stream_00->_send_aux).reset_stream.sender_state == QUICLY_SENDER_STATE_NONE) {
          resched_stream_data(stream_00);
        }
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int handle_max_stream_data_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_max_stream_data_frame_t frame;
    quicly_stream_t *stream;
    int ret;

    if ((ret = quicly_decode_max_stream_data_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(MAX_STREAM_DATA_RECEIVE, conn, conn->stash.now, frame.stream_id, frame.max_stream_data);

    if (!quicly_stream_has_send_side(quicly_is_client(conn), frame.stream_id))
        return QUICLY_TRANSPORT_ERROR_FRAME_ENCODING;

    if ((stream = quicly_get_stream(conn, frame.stream_id)) == NULL)
        return 0;

    if (frame.max_stream_data < stream->_send_aux.max_stream_data)
        return 0;
    stream->_send_aux.max_stream_data = frame.max_stream_data;
    stream->_send_aux.blocked = QUICLY_SENDER_STATE_NONE;

    if (stream->_send_aux.reset_stream.sender_state == QUICLY_SENDER_STATE_NONE)
        resched_stream_data(stream);

    return 0;
}